

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

LY_ERR lyxml_next_attr_content
                 (lyxml_ctx *xmlctx,char **value,size_t *value_len,ly_bool *ws_only,ly_bool *dynamic
                 )

{
  byte bVar1;
  ly_in *plVar2;
  uint uVar3;
  LY_ERR LVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  ly_ctx *ctx;
  
  do {
    plVar2 = xmlctx->in;
    bVar1 = *plVar2->current;
    if (bVar1 < 0xd) {
      if (bVar1 != 9) {
        if (bVar1 != 10) {
          if (bVar1 == 0) goto LAB_001a676b;
          goto LAB_001a66d5;
        }
        plVar2->line = plVar2->line + 1;
      }
    }
    else if ((bVar1 != 0xd) && (bVar1 != 0x20)) break;
    ly_in_skip(plVar2,1);
  } while( true );
  if (bVar1 == 0x3d) {
    ly_in_skip(plVar2,1);
    if (*xmlctx->in->current != '\0') {
      while( true ) {
        plVar2 = xmlctx->in;
        bVar1 = *plVar2->current;
        uVar6 = (ulong)bVar1;
        if (0x27 < uVar6) break;
        if ((0x100002200U >> (uVar6 & 0x3f) & 1) == 0) {
          if (uVar6 != 10) {
            if ((0x8400000000U >> (uVar6 & 0x3f) & 1) != 0) {
              ly_in_skip(plVar2,1);
              if (*xmlctx->in->current != '\0') {
                LVar4 = lyxml_parse_value(xmlctx,bVar1,value,value_len,ws_only,dynamic);
                if (LVar4 != LY_SUCCESS) {
                  return LVar4;
                }
                ly_in_skip(xmlctx->in,1);
                return LY_SUCCESS;
              }
              goto LAB_001a676b;
            }
            break;
          }
          plVar2->line = plVar2->line + 1;
        }
        ly_in_skip(plVar2,1);
      }
      if (bVar1 != 0) {
        ctx = xmlctx->ctx;
        uVar3 = LY_VCODE_INSTREXP_len(plVar2->current);
        pcVar7 = xmlctx->in->current;
        pcVar5 = "either single or double quotation mark";
        goto LAB_001a66ef;
      }
    }
LAB_001a676b:
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
  }
  else {
LAB_001a66d5:
    ctx = xmlctx->ctx;
    uVar3 = LY_VCODE_INSTREXP_len(plVar2->current);
    pcVar7 = xmlctx->in->current;
    pcVar5 = "\'=\'";
LAB_001a66ef:
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
            (ulong)uVar3,pcVar7,pcVar5);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyxml_next_attr_content(struct lyxml_ctx *xmlctx, const char **value, size_t *value_len, ly_bool *ws_only, ly_bool *dynamic)
{
    char quot;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* skip '=' */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if (xmlctx->in->current[0] != '=') {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "'='");
        return LY_EVALID;
    }
    move_input(xmlctx, 1);

    /* skip WS */
    ign_xmlws(xmlctx);

    /* find quotes */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if ((xmlctx->in->current[0] != '\'') && (xmlctx->in->current[0] != '\"')) {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "either single or double quotation mark");
        return LY_EVALID;
    }

    /* remember quote */
    quot = xmlctx->in->current[0];
    move_input(xmlctx, 1);

    /* parse attribute value */
    LY_CHECK_RET(lyxml_parse_value(xmlctx, quot, (char **)value, value_len, ws_only, dynamic));

    /* move after ending quote (without checking for EOF) */
    ly_in_skip(xmlctx->in, 1);

    return LY_SUCCESS;
}